

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O3

void NotifyOfDocumentsClosedElsewhere(ExampleAppDocuments *app)

{
  int iVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if (0 < ShowExampleAppDocuments(bool*)::app) {
    lVar4 = 9;
    lVar5 = 0;
    lVar6 = DAT_00307c30;
    iVar1 = ShowExampleAppDocuments(bool*)::app;
    do {
      cVar2 = *(char *)(lVar6 + -1 + lVar4);
      lVar3 = lVar6;
      if ((cVar2 == '\0') && (*(char *)(lVar6 + lVar4) == '\x01')) {
        ImGui::SetTabItemClosed(*(char **)(lVar6 + -9 + lVar4));
        cVar2 = *(char *)(lVar6 + -1 + lVar4);
        lVar3 = DAT_00307c30;
        iVar1 = ShowExampleAppDocuments(bool*)::app;
      }
      *(char *)(lVar6 + lVar4) = cVar2;
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x20;
      lVar6 = lVar3;
    } while (lVar5 < iVar1);
  }
  return;
}

Assistant:

static void NotifyOfDocumentsClosedElsewhere(ExampleAppDocuments& app)
{
    for (int doc_n = 0; doc_n < app.Documents.Size; doc_n++)
    {
        MyDocument* doc = &app.Documents[doc_n];
        if (!doc->Open && doc->OpenPrev)
            ImGui::SetTabItemClosed(doc->Name);
        doc->OpenPrev = doc->Open;
    }
}